

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O2

void fiobj_str_resize(FIOBJ str,size_t size)

{
  fio_str_info_s local_20;
  
  if (((uint)str & 7) == 2) {
    fio_str_resize(&local_20,(fio_str_s_conflict *)((str & 0xfffffffffffffff8) + 0x10),size);
    *(undefined8 *)((str & 0xfffffffffffffff8) + 8) = 0;
    return;
  }
  __assert_fail("FIOBJ_TYPE_IS(str, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fiobj/fiobj_str.c"
                ,0xdd,"void fiobj_str_resize(FIOBJ, size_t)");
}

Assistant:

void fiobj_str_resize(FIOBJ str, size_t size) {
  assert(FIOBJ_TYPE_IS(str, FIOBJ_T_STRING));
  fio_str_resize(&obj2str(str)->str, size);
  obj2str(str)->hash = 0;
  return;
}